

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O3

Pass * wasm::createOptimizeForJSPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0x108);
  memset(__s,0,0xe0);
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name).field_2._M_local_buf[0] = '\0';
  __s[1]._vptr_Pass = (_func_int **)0x0;
  __s[1].runner = (PassRunner *)0x0;
  __s[4].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__s[4].name.field_2 + 8) = 0;
  __s[5]._vptr_Pass = (_func_int **)0x0;
  __s[5].runner = (PassRunner *)0x0;
  __s[5].name._M_dataplus._M_p = (pointer)0x0;
  __s->_vptr_Pass = (_func_int **)&PTR__WalkerPass_00d74d68;
  return __s;
}

Assistant:

Pass* createOptimizeForJSPass() { return new OptimizeForJSPass(); }